

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp3.c
# Opt level: O3

void mp3_calc_hdr(mp3_frame_t *frame)

{
  ushort uVar1;
  ulong uVar2;
  unsigned_long uVar3;
  unsigned_short *puVar4;
  long lVar5;
  unsigned_long uVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  
  if (frame != (mp3_frame_t *)0x0) {
    if ((ulong)frame->id == 3) {
      uVar3 = bitratetable[frame->bitrate_index];
      frame->bitrate = uVar3;
      puVar4 = sampleratetable[3] + frame->samplerfindex;
      bVar7 = frame->mode == '\x03';
      lVar5 = -0x20;
      if (bVar7) {
        lVar5 = -0x11;
      }
      uVar6 = 0x20;
      if (bVar7) {
        uVar6 = 0x11;
      }
      uVar2 = uVar3 * 0x23280;
    }
    else {
      uVar3 = lsf_bitratetable[frame->bitrate_index];
      frame->bitrate = uVar3;
      puVar4 = sampleratetable[frame->id] + frame->samplerfindex;
      bVar7 = frame->mode == '\x03';
      lVar5 = (ulong)bVar7 * 8 + -0x11;
      uVar6 = (ulong)!bVar7 * 8 + 9;
      uVar2 = uVar3 * 72000;
    }
    uVar1 = *puVar4;
    frame->samplerate = (ulong)uVar1;
    frame->samplelen = 0x480;
    frame->si_size = uVar6;
    frame->si_bitsize = (ulong)(uint)((int)uVar6 * 8);
    uVar6 = (ulong)frame->padding_bit + uVar2 / uVar1;
    frame->frame_size = uVar6;
    frame->frame_data_size = (lVar5 + uVar6) - 4;
    if (frame->protected == '\0') {
      frame->frame_data_size = (lVar5 + uVar6) - 6;
    }
    auVar8._8_4_ = (int)(uVar6 >> 0x20);
    auVar8._0_8_ = uVar6;
    auVar8._12_4_ = 0x45300000;
    auVar9._8_4_ = (int)(uVar3 >> 0x20);
    auVar9._0_8_ = uVar3;
    auVar9._12_4_ = 0x45300000;
    dVar10 = (((auVar8._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0)) * 8.0 * 1000.0) /
             ((auVar9._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0));
    uVar2 = (ulong)dVar10;
    frame->usec = (long)(dVar10 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2;
    return;
  }
  __assert_fail("frame != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/mp3.c",0x31,
                "void mp3_calc_hdr(mp3_frame_t *)");
}

Assistant:

void mp3_calc_hdr(mp3_frame_t *frame) {
  assert(frame != NULL);

  const int is_lsf = frame->id != MPEG_VERSION_1; // MPEG 2 and 2.5 are Lower Sampling Frequency extension

  if (is_lsf) {
    frame->bitrate = lsf_bitratetable[frame->bitrate_index];
  } else {
    frame->bitrate = bitratetable[frame->bitrate_index];

  }
  frame->samplerate = sampleratetable[frame->id][frame->samplerfindex];
  frame->samplelen = 1152; /* only layer III */
  if (is_lsf) {
    frame->si_size = frame->mode != (unsigned char) 3 ? 17 : 9;
  } else {
    frame->si_size = frame->mode != (unsigned char) 3 ? 32 : 17;
  }
  frame->si_bitsize = frame->si_size * 8;

  /* calculate frame length */
  if (is_lsf) {
    frame->frame_size = 72000 * frame->bitrate;
  } else {
    frame->frame_size = 144000 * frame->bitrate;
  }
  frame->frame_size /= frame->samplerate;
  frame->frame_size += frame->padding_bit;

  frame->frame_data_size = frame->frame_size - 4 - frame->si_size;
  if (frame->protected == 0)
    frame->frame_data_size -= 2;

  frame->usec = (double) frame->frame_size * 8 * 1000.0 / ((double) frame->bitrate);
}